

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# number_fluent.cpp
# Opt level: O2

void __thiscall
icu_63::number::impl::SymbolsWrapper::setTo(SymbolsWrapper *this,DecimalFormatSymbols *dfs)

{
  DecimalFormatSymbols *pDVar1;
  
  pDVar1 = dfs;
  doCleanup(this);
  this->fType = SYMPTR_DFS;
  pDVar1 = (DecimalFormatSymbols *)UMemory::operator_new((UMemory *)0xb00,(size_t)pDVar1);
  if (pDVar1 != (DecimalFormatSymbols *)0x0) {
    DecimalFormatSymbols::DecimalFormatSymbols(pDVar1,dfs);
  }
  (this->fPtr).dfs = pDVar1;
  return;
}

Assistant:

void SymbolsWrapper::setTo(const DecimalFormatSymbols& dfs) {
    doCleanup();
    fType = SYMPTR_DFS;
    fPtr.dfs = new DecimalFormatSymbols(dfs);
}